

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SetHasBit(Reflection *this,Message *message,FieldDescriptor *field)

{
  uint *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  
  if ((field->options_->field_0)._impl_.weak_ != true) {
    uVar2 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    if (uVar2 != 0xffffffff) {
      if ((this->schema_).has_bits_offset_ == -1) goto LAB_0029dedc;
      uVar3 = internal::ReflectionSchema::HasBitsOffset(&this->schema_);
      puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar2 >> 5) * 4 + (ulong)uVar3);
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
    }
    return;
  }
  SetHasBit();
LAB_0029dedc:
  SetHasBit();
}

Assistant:

void Reflection::UnsafeArenaAddAllocatedMessage(Message* message,
                                                const FieldDescriptor* field,
                                                Message* new_entry) const {
  USAGE_MUTABLE_CHECK_ALL(UnsafeArenaAddAllocatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaAddAllocatedMessage(field,
                                                                 new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message>>(new_entry);
  }
}